

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * compute_U_value_R2(string *__return_storage_ptr__,string *user_password,
                           EncryptionData *data)

{
  int key_len;
  size_t max_len;
  uchar *data_00;
  uchar *okey;
  EncryptionData *in_RCX;
  allocator local_a1;
  int local_a0 [5];
  allocator<char> local_89;
  string local_88;
  char local_68 [8];
  char udata [32];
  undefined1 local_40 [8];
  string k1;
  EncryptionData *data_local;
  string *user_password_local;
  
  k1.field_2._8_8_ = data;
  QPDF::compute_encryption_key((string *)local_40,(QPDF *)user_password,(string *)data,in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  pad_or_truncate_password_V4(&local_88,local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  local_a0[0] = QPDF::EncryptionData::getLengthBytes((EncryptionData *)k1.field_2._8_8_);
  max_len = QIntC::to_size<int>(local_a0);
  pad_short_parameter((string *)local_40,max_len);
  data_00 = QUtil::unsigned_char_pointer(local_68);
  okey = QUtil::unsigned_char_pointer((string *)local_40);
  key_len = QPDF::EncryptionData::getLengthBytes((EncryptionData *)k1.field_2._8_8_);
  iterate_rc4(data_00,0x20,okey,key_len,1,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_68,0x20,&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string
compute_U_value_R2(std::string const& user_password, QPDF::EncryptionData const& data)
{
    // Algorithm 3.4 from the PDF 1.7 Reference Manual

    std::string k1 = QPDF::compute_encryption_key(user_password, data);
    char udata[key_bytes];
    pad_or_truncate_password_V4("", udata);
    pad_short_parameter(k1, QIntC::to_size(data.getLengthBytes()));
    iterate_rc4(
        QUtil::unsigned_char_pointer(udata),
        key_bytes,
        QUtil::unsigned_char_pointer(k1),
        data.getLengthBytes(),
        1,
        false);
    return {udata, key_bytes};
}